

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O0

string * __thiscall
libtorrent::dht_put_alert::message_abi_cxx11_(string *__return_storage_ptr__,dht_put_alert *this)

{
  uint uVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  difference_type in_RCX;
  span<const_char> in;
  span<const_char> in_00;
  span<const_char> in_01;
  allocator<char> local_5d9;
  aux *local_5d8;
  char *local_5d0;
  string local_5c8;
  allocator<char> local_5a5 [13];
  aux *local_598;
  char *local_590;
  string local_588;
  aux *local_568;
  char *local_560;
  string local_558;
  char local_538 [8];
  char msg [1299];
  dht_put_alert *this_local;
  
  bVar2 = digest32<160L>::is_all_zeros(&this->target);
  if (bVar2) {
    uVar1 = this->num_success;
    span<char_const>::span<std::array<char,32ul>,char,void>
              ((span<char_const> *)&local_568,&this->public_key);
    in.m_len = in_RCX;
    in.m_ptr = local_560;
    libtorrent::aux::to_hex_abi_cxx11_(&local_558,local_568,in);
    uVar5 = std::__cxx11::string::c_str();
    span<char_const>::span<std::array<char,64ul>,char,void>
              ((span<char_const> *)&local_598,&this->signature);
    in_00.m_len = in_RCX;
    in_00.m_ptr = local_590;
    libtorrent::aux::to_hex_abi_cxx11_(&local_588,local_598,in_00);
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    snprintf(local_538,0x513,"DHT put complete (success=%d key=%s sig=%s salt=%s seq=%ld)",
             (ulong)uVar1,uVar5,uVar3,uVar4,this->seq);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_538,local_5a5);
    std::allocator<char>::~allocator(local_5a5);
  }
  else {
    uVar1 = this->num_success;
    span<char_const>::span<libtorrent::digest32<160l>,char,void>
              ((span<char_const> *)&local_5d8,&this->target);
    in_01.m_len = in_RCX;
    in_01.m_ptr = local_5d0;
    libtorrent::aux::to_hex_abi_cxx11_(&local_5c8,local_5d8,in_01);
    uVar5 = std::__cxx11::string::c_str();
    snprintf(local_538,0x513,"DHT put commplete (success=%d hash=%s)",(ulong)uVar1,uVar5);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,local_538,&local_5d9);
    std::allocator<char>::~allocator(&local_5d9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string dht_put_alert::message() const
	{
		char msg[MAX_DHT_MUTABLE_DATA_LENGTH + 50];
		if (target.is_all_zeros())
		{
			std::snprintf(msg, sizeof(msg), "DHT put complete (success=%d key=%s sig=%s salt=%s seq=%" PRId64 ")"
				, num_success
				, aux::to_hex(public_key).c_str()
				, aux::to_hex(signature).c_str()
				, salt.c_str()
				, seq);
			return msg;
		}

		std::snprintf(msg, sizeof(msg), "DHT put commplete (success=%d hash=%s)"
			, num_success
			, aux::to_hex(target).c_str());
		return msg;
	}